

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double dVar2;
  undefined8 uVar3;
  KUINT16 i_1;
  undefined8 *puVar4;
  double *pdVar5;
  double *pdVar6;
  KUINT16 i;
  long lVar7;
  float (*pafVar8) [3];
  KUINT16 j;
  long lVar9;
  undefined4 uVar10;
  TMATRIX I;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> m;
  double local_68;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  float local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  pdVar5 = &local_68;
  pdVar6 = &local_68;
  puVar4 = &local_5c;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar7 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)puVar4 + lVar9 * 4) = uVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    puVar4 = (undefined8 *)((long)puVar4 + 0xc);
  } while (lVar7 != 3);
  local_68 = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude);
  if (local_68 <= 1e-05) {
    res->Data[2][2] = local_3c;
    *(undefined8 *)(res->Data[1] + 1) = local_4c;
    *(undefined8 *)res->Data[2] = uStack_44;
    *(undefined8 *)res->Data[0] = local_5c;
    *(undefined8 *)(res->Data[0] + 2) = uStack_54;
  }
  else {
    dVar2 = cos(local_68);
    fVar1 = (float)this->m_f64Magnitude;
    uVar3 = *(undefined8 *)((this->m_wwMatrix).Data[0] + 2);
    *(undefined8 *)res->Data[0] = *(undefined8 *)(this->m_wwMatrix).Data[0];
    *(undefined8 *)(res->Data[0] + 2) = uVar3;
    uVar3 = *(undefined8 *)(this->m_wwMatrix).Data[2];
    *(undefined8 *)(res->Data[1] + 1) = *(undefined8 *)((this->m_wwMatrix).Data[1] + 1);
    *(undefined8 *)res->Data[2] = uVar3;
    res->Data[2][2] = (this->m_wwMatrix).Data[2][2];
    lVar7 = 0;
    pafVar8 = (float (*) [3])res;
    do {
      lVar9 = 0;
      do {
        (*(float (*) [3])*pafVar8)[lVar9] =
             (*(float (*) [3])*pafVar8)[lVar9] * ((1.0 - (float)dVar2) / (fVar1 * fVar1));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      pafVar8 = pafVar8 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      pdVar5 = (double *)((long)pdVar5 + 0xc);
      lVar9 = 0;
      do {
        *(float *)((long)pdVar5 + lVar9 * 4) = *(float *)((long)pdVar5 + lVar9 * 4) * (float)dVar2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    dVar2 = sin(local_68);
    fVar1 = (float)this->m_f64Magnitude;
    lVar7 = 0;
    pafVar8 = (float (*) [3])res;
    do {
      pdVar6 = (double *)((long)pdVar6 + 0xc);
      lVar9 = 0;
      do {
        (*(float (*) [3])*pafVar8)[lVar9] =
             *(float *)((long)pdVar6 + lVar9 * 4) + (*(float (*) [3])*pafVar8)[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      pafVar8 = pafVar8 + 1;
    } while (lVar7 != 3);
    puVar4 = &local_38;
    local_18 = (this->m_SkewOmegaMatrix).Data[2][2];
    local_28 = *(undefined8 *)((this->m_SkewOmegaMatrix).Data[1] + 1);
    uStack_20 = *(undefined8 *)(this->m_SkewOmegaMatrix).Data[2];
    local_38 = *(undefined8 *)(this->m_SkewOmegaMatrix).Data[0];
    uStack_30 = *(undefined8 *)((this->m_SkewOmegaMatrix).Data[0] + 2);
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        *(float *)((long)puVar4 + lVar9 * 4) =
             (float)((double)*(float *)((long)puVar4 + lVar9 * 4) * (dVar2 / (double)fVar1));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      puVar4 = (undefined8 *)((long)puVar4 + 0xc);
    } while (lVar7 != 3);
    puVar4 = &local_38;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        (*(float (*) [3])*(float (*) [3])res)[lVar9] =
             (*(float (*) [3])*(float (*) [3])res)[lVar9] - *(float *)((long)puVar4 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      res = (TMATRIX *)((long)res + 0xc);
      puVar4 = (undefined8 *)((long)puVar4 + 0xc);
    } while (lVar7 != 3);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    TMATRIX I;
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        const KFLOAT32 f64CosMagDelta = cos( f64DeltaMag );
        const KFLOAT64 fwwScalar = ( 1 - f64CosMagDelta ) / ( m_f64Magnitude * m_f64Magnitude );
        res = m_wwMatrix;
        res *= fwwScalar;
        I *= f64CosMagDelta;
        const KFLOAT64 f64SkewScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        res += I;
        res -= ( m_SkewOmegaMatrix * f64SkewScalar );
    }
    else
    {
        res = I; // Identity matrix
    }
}